

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManDumpBlif(Bbl_Man_t *p,char *pFileName)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  Bbl_Obj_t *local_30;
  Bbl_Obj_t *pFanin;
  Bbl_Obj_t *pObj;
  FILE *pFile;
  char *pFileName_local;
  Bbl_Man_t *p_local;
  
  __stream = fopen(pFileName,"w");
  fprintf(__stream,"# Test file written by Bbl_ManDumpBlif() in ABC.\n");
  pcVar3 = Bbl_ManName(p);
  fprintf(__stream,".model %s\n",pcVar3);
  pFanin = Bbl_ManObjFirst(p);
  do {
    if (pFanin == (Bbl_Obj_t *)0x0) {
      for (pFanin = Bbl_ManObjFirst(p); pFanin != (Bbl_Obj_t *)0x0;
          pFanin = Bbl_ManObjNext(p,pFanin)) {
        iVar1 = Bbl_ObjIsOutput(pFanin);
        if (iVar1 != 0) {
          fprintf(__stream,".names");
          for (local_30 = Bbl_ObjFaninFirst(pFanin); local_30 != (Bbl_Obj_t *)0x0;
              local_30 = Bbl_ObjFaninNext(pFanin,local_30)) {
            uVar2 = Bbl_ObjId(local_30);
            fprintf(__stream," %d",(ulong)uVar2);
          }
          uVar2 = Bbl_ObjId(pFanin);
          fprintf(__stream," %d\n",(ulong)uVar2);
          fprintf(__stream,"1 1\n");
        }
      }
      fprintf(__stream,".end\n");
      fclose(__stream);
      return;
    }
    iVar1 = Bbl_ObjIsInput(pFanin);
    if (iVar1 == 0) {
      iVar1 = Bbl_ObjIsOutput(pFanin);
      if (iVar1 == 0) {
        iVar1 = Bbl_ObjIsLut(pFanin);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                        ,0x4d8,"void Bbl_ManDumpBlif(Bbl_Man_t *, char *)");
        }
        fprintf(__stream,".names");
        for (local_30 = Bbl_ObjFaninFirst(pFanin); local_30 != (Bbl_Obj_t *)0x0;
            local_30 = Bbl_ObjFaninNext(pFanin,local_30)) {
          uVar2 = Bbl_ObjId(local_30);
          fprintf(__stream," %d",(ulong)uVar2);
        }
        uVar2 = Bbl_ObjId(pFanin);
        fprintf(__stream," %d\n",(ulong)uVar2);
        pcVar3 = Bbl_ObjSop(p,pFanin);
        fprintf(__stream,"%s",pcVar3);
      }
      else {
        uVar2 = Bbl_ObjId(pFanin);
        fprintf(__stream,".outputs %d\n",(ulong)uVar2);
      }
    }
    else {
      uVar2 = Bbl_ObjId(pFanin);
      fprintf(__stream,".inputs %d\n",(ulong)uVar2);
    }
    pFanin = Bbl_ManObjNext(p,pFanin);
  } while( true );
}

Assistant:

void Bbl_ManDumpBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Bbl_Obj_t * pObj, * pFanin;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# Test file written by Bbl_ManDumpBlif() in ABC.\n" );
    fprintf( pFile, ".model %s\n", Bbl_ManName(p) );
    // write objects
    Bbl_ManForEachObj( p, pObj )
    {
        if ( Bbl_ObjIsInput(pObj) )
            fprintf( pFile, ".inputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsOutput(pObj) )
            fprintf( pFile, ".outputs %d\n", Bbl_ObjId(pObj) );
        else if ( Bbl_ObjIsLut(pObj) )
        {
            fprintf( pFile, ".names" );
            Bbl_ObjForEachFanin( pObj, pFanin )
                fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
            fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
            fprintf( pFile, "%s", Bbl_ObjSop(p, pObj) );
        }
        else assert( 0 );
    }
    // write output drivers
    Bbl_ManForEachObj( p, pObj )
    {
        if ( !Bbl_ObjIsOutput(pObj) )
            continue;
        fprintf( pFile, ".names" );
        Bbl_ObjForEachFanin( pObj, pFanin )
            fprintf( pFile, " %d", Bbl_ObjId(pFanin) );
        fprintf( pFile, " %d\n", Bbl_ObjId(pObj) );
        fprintf( pFile, "1 1\n" );
    }
    fprintf( pFile, ".end\n" );
    fclose( pFile );
}